

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

void __thiscall Liby::EventLoopGroup::EventLoopGroup(EventLoopGroup *this,int n,string *chooser)

{
  int iVar1;
  _Alloc_hider local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this->n_ = n;
  *(undefined8 *)&(this->bf_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->bf_).super__Function_base._M_functor + 8) = 0;
  (this->bf_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->bf_)._M_invoker = (_Invoker_type)0x0;
  std::__cxx11::string::string((string *)&this->chooser_,(string *)chooser);
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar1 = 0; iVar1 <= n; iVar1 = iVar1 + 1) {
    std::make_shared<Liby::EventLoop,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    std::vector<std::shared_ptr<Liby::EventLoop>,std::allocator<std::shared_ptr<Liby::EventLoop>>>::
    emplace_back<std::shared_ptr<Liby::EventLoop>>
              ((vector<std::shared_ptr<Liby::EventLoop>,std::allocator<std::shared_ptr<Liby::EventLoop>>>
                *)&this->loops_,(shared_ptr<Liby::EventLoop> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    local_40._M_p =
         (pointer)(this->loops_).
                  super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::vector<Liby::EventLoop*,std::allocator<Liby::EventLoop*>>::emplace_back<Liby::EventLoop*>
              ((vector<Liby::EventLoop*,std::allocator<Liby::EventLoop*>> *)&this->ploops_,
               (EventLoop **)&local_40);
  }
  EventLoop::bind_to_thread
            (*(this->ploops_).
              super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
              super__Vector_impl_data._M_start);
  return;
}

Assistant:

EventLoopGroup::EventLoopGroup(int n, const std::string &chooser)
    : n_(n), chooser_(chooser) {
    for (int i = 0; i < n + 1; i++) {
        loops_.emplace_back(std::make_shared<EventLoop>(chooser));
        ploops_.push_back(loops_.back().get());
    }
    ploops_[0]->bind_to_thread();
}